

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

uchar * __thiscall kj::Vector<unsigned_char>::add<char>(Vector<unsigned_char> *this,char *params)

{
  bool bVar1;
  char *params_00;
  uchar *puVar2;
  char *params_local;
  Vector<unsigned_char> *this_local;
  
  bVar1 = ArrayBuilder<unsigned_char>::isFull(&this->builder);
  if (bVar1) {
    grow(this,0);
  }
  params_00 = fwd<char>(params);
  puVar2 = ArrayBuilder<unsigned_char>::add<char>(&this->builder,params_00);
  return puVar2;
}

Assistant:

inline T& add(Params&&... params) KJ_LIFETIMEBOUND {
    if (builder.isFull()) grow();
    return builder.add(kj::fwd<Params>(params)...);
  }